

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_exception.cc
# Opt level: O2

void __thiscall
rcdiscover::SocketException::SocketException(SocketException *this,string *msg,int errnum)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)msg);
  *(undefined ***)this = &PTR__SocketException_00120ca8;
  this->errnum_ = errnum;
  std::operator+(&local_38,msg," - ");
  std::__cxx11::to_string(&sStack_58,errnum);
  std::operator+(&this->msg_,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

SocketException::SocketException(const std::string& msg, const int errnum) :
  std::runtime_error(msg),
  errnum_(errnum),
  msg_(msg + " - " + std::to_string(errnum))
{ }